

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_expression(Parser *this)

{
  bool bVar1;
  Token *pTVar2;
  AbstractSyntaxNode *pAVar3;
  int local_20;
  Type local_1c [3];
  Parser *local_10;
  Parser *this_local;
  
  pAVar3 = this->current_;
  local_1c[2] = 0x38;
  local_1c[1] = 1;
  local_10 = this;
  pTVar2 = forward_token(this,(int *)(local_1c + 1));
  pAVar3 = AbstractSyntaxNode::add_child(pAVar3,local_1c + 2,pTVar2);
  this->current_ = pAVar3;
  parse_term(this);
  while( true ) {
    local_20 = 1;
    pTVar2 = forward_token(this,&local_20);
    local_1c[0] = Token::type(pTVar2);
    bVar1 = is_add_op(this,local_1c);
    if (!bVar1) break;
    parse_add_op(this);
    parse_term(this);
  }
  pAVar3 = AbstractSyntaxNode::parent(this->current_);
  this->current_ = pAVar3;
  return;
}

Assistant:

void Parser::parse_expression() {
    current_ = current_->add_child(Token::Type::kExpression, forward_token());

    parse_term();
    while (is_add_op(forward_token().type())) {
        parse_add_op();
        parse_term();
    }

    current_ = current_->parent();
}